

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O0

Status __thiscall leveldb::TableBuilder::ChangeOptions(TableBuilder *this,Options *options)

{
  long lVar1;
  char *pcVar2;
  long *in_RDX;
  Slice *in_RSI;
  Slice *in_RDI;
  long in_FS_OFFSET;
  Slice *msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDX == *(long *)in_RSI->data_) {
    memcpy(in_RSI->data_,in_RDX,0x60);
    memcpy(in_RSI->data_ + 0x60,in_RDX,0x60);
    pcVar2 = in_RSI->data_;
    pcVar2[0xa0] = '\x01';
    pcVar2[0xa1] = '\0';
    pcVar2[0xa2] = '\0';
    pcVar2[0xa3] = '\0';
    Status::OK();
  }
  else {
    msg = in_RDI;
    Slice::Slice(in_RSI,(char *)in_RDI);
    Slice::Slice(in_RDI);
    Status::InvalidArgument(msg,in_RDI);
    in_RDI = msg;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status TableBuilder::ChangeOptions(const Options& options) {
  // Note: if more fields are added to Options, update
  // this function to catch changes that should not be allowed to
  // change in the middle of building a Table.
  if (options.comparator != rep_->options.comparator) {
    return Status::InvalidArgument("changing comparator while building table");
  }

  // Note that any live BlockBuilders point to rep_->options and therefore
  // will automatically pick up the updated options.
  rep_->options = options;
  rep_->index_block_options = options;
  rep_->index_block_options.block_restart_interval = 1;
  return Status::OK();
}